

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTBinaryComparisionExpression.cpp
# Opt level: O0

int __thiscall
MathML::AST::BinaryComparisonExpression::clone
          (BinaryComparisonExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  int iVar1;
  BinaryComparisonExpression *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BinaryComparisonExpression *copy;
  
  this_00 = (BinaryComparisonExpression *)operator_new(0x20);
  BinaryComparisonExpression(this_00);
  this_00->mOperator = this->mOperator;
  if (this->mLeftOperand == (INode *)0x0) {
    this_00->mLeftOperand = (INode *)0x0;
  }
  else {
    iVar1 = (*this->mLeftOperand->_vptr_INode[4])(this->mLeftOperand,(ulong)__fn & 0xffffffff);
    this_00->mLeftOperand = (INode *)CONCAT44(extraout_var,iVar1);
  }
  if (this->mRightOperand == (INode *)0x0) {
    this_00->mRightOperand = (INode *)0x0;
  }
  else {
    iVar1 = (*this->mRightOperand->_vptr_INode[4])(this->mRightOperand,(ulong)__fn & 0xffffffff);
    this_00->mRightOperand = (INode *)CONCAT44(extraout_var_00,iVar1);
  }
  return (int)this_00;
}

Assistant:

INode* BinaryComparisonExpression::clone(CloneFlags cloneFlags) const
        {
            BinaryComparisonExpression* copy = new BinaryComparisonExpression();
            copy->mOperator = mOperator;

            if ( mLeftOperand )
                copy->mLeftOperand = mLeftOperand->clone(cloneFlags);
            else
                copy->mLeftOperand = 0;

            if ( mRightOperand )
                copy->mRightOperand = mRightOperand->clone(cloneFlags);
            else
                copy->mRightOperand = 0;

            return copy;
        }